

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_external_replayer.cpp
# Opt level: O0

bool __thiscall
Fossilize::ExternalReplayer::get_raytracing_failed_validation
          (ExternalReplayer *this,size_t *num_hashes,Hash *hashes)

{
  bool bVar1;
  Hash *hashes_local;
  size_t *num_hashes_local;
  ExternalReplayer *this_local;
  
  bVar1 = Impl::get_raytracing_failed_validation(this->impl,num_hashes,hashes);
  return bVar1;
}

Assistant:

bool ExternalReplayer::get_raytracing_failed_validation(size_t *num_hashes, Hash *hashes) const
{
	return impl->get_raytracing_failed_validation(num_hashes, hashes);
}